

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# faidx.c
# Opt level: O1

int fai_build(char *fn)

{
  uint uVar1;
  size_t sVar2;
  char *__s;
  BGZF *fp;
  faidx_t *fai;
  FILE *__stream;
  
  sVar2 = strlen(fn);
  __s = (char *)calloc(sVar2 + 5,1);
  sprintf(__s,"%s.fai",fn);
  fp = bgzf_open(fn,"r");
  if (fp == (BGZF *)0x0) {
    fprintf(_stderr,"[fai_build] fail to open the FASTA file %s\n",fn);
  }
  else {
    if ((fp->field_0x3 & 0x60) != 0) {
      bgzf_index_build_init(fp);
    }
    fai = fai_build_core(fp);
    uVar1 = *(uint *)fp;
    if (fai != (faidx_t *)0x0) {
      if ((uVar1 & 0x60000000) != 0) {
        bgzf_index_dump(fp,fn,".gzi");
      }
      bgzf_close(fp);
      __stream = fopen(__s,"wb");
      if (__stream == (FILE *)0x0) {
        fai_build_cold_1();
        return -1;
      }
      fai_save(fai,(FILE *)__stream);
      fclose(__stream);
      free(__s);
      fai_destroy(fai);
      return 0;
    }
    if ((int)uVar1 < 0 && (uVar1 & 0x60000000) != 0) {
      fai_build_cold_2();
    }
  }
  free(__s);
  return -1;
}

Assistant:

int fai_build(const char *fn)
{
    char *str;
    BGZF *bgzf;
    FILE *fp;
    faidx_t *fai;
    str = (char*)calloc(strlen(fn) + 5, 1);
    sprintf(str, "%s.fai", fn);
    bgzf = bgzf_open(fn, "r");
    if ( !bgzf ) {
        fprintf(stderr, "[fai_build] fail to open the FASTA file %s\n",fn);
        free(str);
        return -1;
    }
    if ( bgzf->is_compressed ) bgzf_index_build_init(bgzf);
    fai = fai_build_core(bgzf);
    if ( !fai )
    {
        if ( bgzf->is_compressed && bgzf->is_gzip ) fprintf(stderr,"Cannot index files compressed with gzip, please use bgzip\n");
        free(str);
        return -1;
    }
    if ( bgzf->is_compressed ) bgzf_index_dump(bgzf, fn, ".gzi");
    bgzf_close(bgzf);
    fp = fopen(str, "wb");
    if ( !fp ) {
        fprintf(stderr, "[fai_build] fail to write FASTA index %s\n",str);
        fai_destroy(fai); free(str);
        return -1;
    }
    fai_save(fai, fp);
    fclose(fp);
    free(str);
    fai_destroy(fai);
    return 0;
}